

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O3

void __thiscall
duckdb::ReservoirQuantileState<signed_char>::FillReservoir
          (ReservoirQuantileState<signed_char> *this,idx_t sample_size,char element)

{
  ulong uVar1;
  BaseReservoirSampling *pBVar2;
  
  uVar1 = this->pos;
  if (uVar1 < sample_size) {
    this->pos = uVar1 + 1;
    this->v[uVar1] = element;
    BaseReservoirSampling::InitializeReservoirWeights(this->r_samp,this->pos,this->len);
    return;
  }
  pBVar2 = this->r_samp;
  if (pBVar2->next_index_to_sample == pBVar2->num_entries_to_skip_b4_next_sample) {
    this->v[pBVar2->min_weighted_entry_index] = element;
    BaseReservoirSampling::ReplaceElement(this->r_samp,-1.0);
    return;
  }
  return;
}

Assistant:

void FillReservoir(idx_t sample_size, T element) {
		if (pos < sample_size) {
			v[pos++] = element;
			r_samp->InitializeReservoirWeights(pos, len);
		} else {
			D_ASSERT(r_samp->next_index_to_sample >= r_samp->num_entries_to_skip_b4_next_sample);
			if (r_samp->next_index_to_sample == r_samp->num_entries_to_skip_b4_next_sample) {
				ReplaceElement(element);
			}
		}
	}